

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

int ImTextStrToUtf8(char *buf,int buf_size,ImWchar *in_text,ImWchar *in_text_end)

{
  byte *pbVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  iVar3 = (int)buf;
  pbVar1 = (byte *)(buf + (long)buf_size + -1);
  do {
    while( true ) {
      if (((pbVar1 <= buf) || (in_text_end != (ImWchar *)0x0 && in_text_end <= in_text)) ||
         (uVar2 = *in_text, uVar2 == 0)) {
        *buf = 0;
        return (uint)buf - iVar3;
      }
      in_text = in_text + 1;
      if (0x7f < uVar2) break;
      *buf = (byte)uVar2;
      buf = (char *)((byte *)buf + 1);
    }
    iVar4 = ~(uint)buf + iVar3 + buf_size;
    if (uVar2 < 0x800) {
      if (1 < iVar4) {
        *buf = (byte)(uVar2 >> 6) | 0xc0;
        lVar6 = 1;
        lVar5 = 2;
        goto LAB_002c8d4f;
      }
LAB_002c8d23:
      lVar5 = 0;
    }
    else {
      if ((uVar2 & 0xfc00) == 0xdc00) goto LAB_002c8d23;
      if ((uVar2 & 0xfc00) == 0xd800) {
        if (iVar4 < 4) goto LAB_002c8d23;
        ((byte *)buf)[0] = 0xf0;
        ((byte *)buf)[1] = 0x8d;
        ((byte *)buf)[2] = (byte)(uVar2 >> 6) & 0x2f | 0x80;
        lVar6 = 3;
        lVar5 = 4;
      }
      else {
        if (iVar4 < 3) goto LAB_002c8d23;
        *buf = (byte)(uVar2 >> 0xc) | 0xe0;
        ((byte *)buf)[1] = (byte)(uVar2 >> 6) & 0x3f | 0x80;
        lVar6 = 2;
        lVar5 = 3;
      }
LAB_002c8d4f:
      ((byte *)buf)[lVar6] = (byte)uVar2 & 0x3f | 0x80;
    }
    buf = (char *)((byte *)buf + lVar5);
  } while( true );
}

Assistant:

int ImTextStrToUtf8(char* buf, int buf_size, const ImWchar* in_text, const ImWchar* in_text_end)
{
    char* buf_out = buf;
    const char* buf_end = buf + buf_size;
    while (buf_out < buf_end-1 && (!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c = (unsigned int)(*in_text++);
        if (c < 0x80)
            *buf_out++ = (char)c;
        else
            buf_out += ImTextCharToUtf8(buf_out, (int)(buf_end-buf_out-1), c);
    }
    *buf_out = 0;
    return (int)(buf_out - buf);
}